

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O3

String * sf::priv::KeyboardImpl::getDescription(String *__return_storage_ptr__,Scancode code)

{
  Uint32 utf32Char;
  KeySym keysym;
  uint uVar1;
  locale alStack_18 [8];
  
  uVar1 = code + ~Num0;
  if ((0x3d < uVar1) || ((0x3f808c000000001fU >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
    keysym = anon_unknown.dwarf_597764::scancodeToKeySym(code);
    utf32Char = keysymToUnicode(keysym);
    if (utf32Char != 0) {
      String::String(__return_storage_ptr__,utf32Char);
      return __return_storage_ptr__;
    }
  }
  switch((ulong)uVar1) {
  case 0:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Enter",alStack_18);
    break;
  case 1:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Escape",alStack_18);
    break;
  case 2:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Backspace",alStack_18);
    break;
  case 3:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Tab",alStack_18);
    break;
  case 4:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Space",alStack_18);
    break;
  default:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Unknown Scancode",alStack_18);
    break;
  case 0x10:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F1",alStack_18);
    break;
  case 0x11:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F2",alStack_18);
    break;
  case 0x12:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F3",alStack_18);
    break;
  case 0x13:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F4",alStack_18);
    break;
  case 0x14:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F5",alStack_18);
    break;
  case 0x15:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F6",alStack_18);
    break;
  case 0x16:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F7",alStack_18);
    break;
  case 0x17:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F8",alStack_18);
    break;
  case 0x18:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F9",alStack_18);
    break;
  case 0x19:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F10",alStack_18);
    break;
  case 0x1a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F11",alStack_18);
    break;
  case 0x1b:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F12",alStack_18);
    break;
  case 0x1c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F13",alStack_18);
    break;
  case 0x1d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F14",alStack_18);
    break;
  case 0x1e:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F15",alStack_18);
    break;
  case 0x1f:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F16",alStack_18);
    break;
  case 0x20:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F17",alStack_18);
    break;
  case 0x21:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F18",alStack_18);
    break;
  case 0x22:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F19",alStack_18);
    break;
  case 0x23:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F20",alStack_18);
    break;
  case 0x24:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F21",alStack_18);
    break;
  case 0x25:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F22",alStack_18);
    break;
  case 0x26:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F23",alStack_18);
    break;
  case 0x27:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"F24",alStack_18);
    break;
  case 0x28:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Caps Lock",alStack_18);
    break;
  case 0x29:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Print Screen",alStack_18);
    break;
  case 0x2a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Scroll Lock",alStack_18);
    break;
  case 0x2b:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Pause",alStack_18);
    break;
  case 0x2c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Insert",alStack_18);
    break;
  case 0x2d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Home",alStack_18);
    break;
  case 0x2e:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Page Up",alStack_18);
    break;
  case 0x2f:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Delete",alStack_18);
    break;
  case 0x30:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"End",alStack_18);
    break;
  case 0x31:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Page Down",alStack_18);
    break;
  case 0x32:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Right Arrow",alStack_18);
    break;
  case 0x33:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Left Arrow",alStack_18);
    break;
  case 0x34:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Down Arrow",alStack_18);
    break;
  case 0x35:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Up Arrow",alStack_18);
    break;
  case 0x36:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Num Lock",alStack_18);
    break;
  case 0x37:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Divide (Numpad)",alStack_18);
    break;
  case 0x38:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Multiply (Numpad)",alStack_18);
    break;
  case 0x39:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Minus (Numpad)",alStack_18);
    break;
  case 0x3a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Plus (Numpad)",alStack_18);
    break;
  case 0x3b:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Equal (Numpad)",alStack_18);
    break;
  case 0x3c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Enter (Numpad)",alStack_18);
    break;
  case 0x3d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Decimal (Numpad)",alStack_18);
    break;
  case 0x3e:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"1 (Numpad)",alStack_18);
    break;
  case 0x3f:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"2 (Numpad)",alStack_18);
    break;
  case 0x40:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"3 (Numpad)",alStack_18);
    break;
  case 0x41:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"4 (Numpad)",alStack_18);
    break;
  case 0x42:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"5 (Numpad)",alStack_18);
    break;
  case 0x43:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"6 (Numpad)",alStack_18);
    break;
  case 0x44:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"7 (Numpad)",alStack_18);
    break;
  case 0x45:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"8 (Numpad)",alStack_18);
    break;
  case 0x46:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"9 (Numpad)",alStack_18);
    break;
  case 0x47:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"0 (Numpad)",alStack_18);
    break;
  case 0x49:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Application",alStack_18);
    break;
  case 0x4a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Execute",alStack_18);
    break;
  case 0x4c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Help",alStack_18);
    break;
  case 0x4d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Menu",alStack_18);
    break;
  case 0x4e:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Select",alStack_18);
    break;
  case 0x4f:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Redo",alStack_18);
    break;
  case 0x50:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Undo",alStack_18);
    break;
  case 0x51:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Cut",alStack_18);
    break;
  case 0x52:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Copy",alStack_18);
    break;
  case 0x53:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Paste",alStack_18);
    break;
  case 0x54:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Volume Mute",alStack_18);
    break;
  case 0x55:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Volume Up",alStack_18);
    break;
  case 0x56:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Volume Down",alStack_18);
    break;
  case 0x57:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Media Play Pause",alStack_18);
    break;
  case 0x58:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Media Stop",alStack_18);
    break;
  case 0x59:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Media Next Track",alStack_18);
    break;
  case 0x5a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Media Previous Track",alStack_18);
    break;
  case 0x5b:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Left Control",alStack_18);
    break;
  case 0x5c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Left Shift",alStack_18);
    break;
  case 0x5d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Left Alt",alStack_18);
    break;
  case 0x5e:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Left System",alStack_18);
    break;
  case 0x5f:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Right Control",alStack_18);
    break;
  case 0x60:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Right Shift",alStack_18);
    break;
  case 0x61:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Right Alt",alStack_18);
    break;
  case 0x62:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Right System",alStack_18);
    break;
  case 99:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Back",alStack_18);
    break;
  case 100:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Forward",alStack_18);
    break;
  case 0x65:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Refresh",alStack_18);
    break;
  case 0x66:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Stop",alStack_18);
    break;
  case 0x67:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Search",alStack_18);
    break;
  case 0x68:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Favorites",alStack_18);
    break;
  case 0x69:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Home Page",alStack_18);
    break;
  case 0x6a:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Launch Application 1",alStack_18);
    break;
  case 0x6b:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Launch Application 2",alStack_18);
    break;
  case 0x6c:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Launch Mail",alStack_18);
    break;
  case 0x6d:
    std::locale::locale(alStack_18);
    String::String(__return_storage_ptr__,"Launch Media Select",alStack_18);
  }
  std::locale::~locale(alStack_18);
  return __return_storage_ptr__;
}

Assistant:

String KeyboardImpl::getDescription(Keyboard::Scancode code)
{
    bool checkInput = true;

    // these scancodes actually correspond to keys with input
    // but we want to return their description, not their behaviour
    if (code == Keyboard::Scan::Enter          ||
        code == Keyboard::Scan::Escape         ||
        code == Keyboard::Scan::Backspace      ||
        code == Keyboard::Scan::Tab            ||
        code == Keyboard::Scan::Space          ||
        code == Keyboard::Scan::ScrollLock     ||
        code == Keyboard::Scan::Pause          ||
        code == Keyboard::Scan::Delete         ||
        code == Keyboard::Scan::NumpadDivide   ||
        code == Keyboard::Scan::NumpadMultiply ||
        code == Keyboard::Scan::NumpadMinus    ||
        code == Keyboard::Scan::NumpadPlus     ||
        code == Keyboard::Scan::NumpadEqual    ||
        code == Keyboard::Scan::NumpadEnter    ||
        code == Keyboard::Scan::NumpadDecimal)
    {
        checkInput = false;
    }

    if (checkInput)
    {
        KeySym keysym = scancodeToKeySym(code);
        Uint32 unicode = keysymToUnicode(keysym);

        if (unicode != 0)
            return String(unicode);
    }

    // Fallback to our best guess for the keys that are known to be independent of the layout.
    switch (code)
    {
        case Keyboard::Scan::Enter:              return "Enter";
        case Keyboard::Scan::Escape:             return "Escape";
        case Keyboard::Scan::Backspace:          return "Backspace";
        case Keyboard::Scan::Tab:                return "Tab";
        case Keyboard::Scan::Space:              return "Space";

        case Keyboard::Scan::F1:                 return "F1";
        case Keyboard::Scan::F2:                 return "F2";
        case Keyboard::Scan::F3:                 return "F3";
        case Keyboard::Scan::F4:                 return "F4";
        case Keyboard::Scan::F5:                 return "F5";
        case Keyboard::Scan::F6:                 return "F6";
        case Keyboard::Scan::F7:                 return "F7";
        case Keyboard::Scan::F8:                 return "F8";
        case Keyboard::Scan::F9:                 return "F9";
        case Keyboard::Scan::F10:                return "F10";
        case Keyboard::Scan::F11:                return "F11";
        case Keyboard::Scan::F12:                return "F12";
        case Keyboard::Scan::F13:                return "F13";
        case Keyboard::Scan::F14:                return "F14";
        case Keyboard::Scan::F15:                return "F15";
        case Keyboard::Scan::F16:                return "F16";
        case Keyboard::Scan::F17:                return "F17";
        case Keyboard::Scan::F18:                return "F18";
        case Keyboard::Scan::F19:                return "F19";
        case Keyboard::Scan::F20:                return "F20";
        case Keyboard::Scan::F21:                return "F21";
        case Keyboard::Scan::F22:                return "F22";
        case Keyboard::Scan::F23:                return "F23";
        case Keyboard::Scan::F24:                return "F24";

        case Keyboard::Scan::CapsLock:           return "Caps Lock";
        case Keyboard::Scan::PrintScreen:        return "Print Screen";
        case Keyboard::Scan::ScrollLock:         return "Scroll Lock";

        case Keyboard::Scan::Pause:              return "Pause";
        case Keyboard::Scan::Insert:             return "Insert";
        case Keyboard::Scan::Home:               return "Home";
        case Keyboard::Scan::PageUp:             return "Page Up";
        case Keyboard::Scan::Delete:             return "Delete";
        case Keyboard::Scan::End:                return "End";
        case Keyboard::Scan::PageDown:           return "Page Down";

        case Keyboard::Scan::Left:               return "Left Arrow";
        case Keyboard::Scan::Right:              return "Right Arrow";
        case Keyboard::Scan::Down:               return "Down Arrow";
        case Keyboard::Scan::Up:                 return "Up Arrow";

        case Keyboard::Scan::NumLock:            return "Num Lock";
        case Keyboard::Scan::NumpadDivide:       return "Divide (Numpad)";
        case Keyboard::Scan::NumpadMultiply:     return "Multiply (Numpad)";
        case Keyboard::Scan::NumpadMinus:        return "Minus (Numpad)";
        case Keyboard::Scan::NumpadPlus:         return "Plus (Numpad)";
        case Keyboard::Scan::NumpadEqual:        return "Equal (Numpad)";
        case Keyboard::Scan::NumpadEnter:        return "Enter (Numpad)";
        case Keyboard::Scan::NumpadDecimal:      return "Decimal (Numpad)";

        case Keyboard::Scan::Numpad0:            return "0 (Numpad)";
        case Keyboard::Scan::Numpad1:            return "1 (Numpad)";
        case Keyboard::Scan::Numpad2:            return "2 (Numpad)";
        case Keyboard::Scan::Numpad3:            return "3 (Numpad)";
        case Keyboard::Scan::Numpad4:            return "4 (Numpad)";
        case Keyboard::Scan::Numpad5:            return "5 (Numpad)";
        case Keyboard::Scan::Numpad6:            return "6 (Numpad)";
        case Keyboard::Scan::Numpad7:            return "7 (Numpad)";
        case Keyboard::Scan::Numpad8:            return "8 (Numpad)";
        case Keyboard::Scan::Numpad9:            return "9 (Numpad)";

        case Keyboard::Scan::Application:        return "Application";
        case Keyboard::Scan::Execute:            return "Execute";
        case Keyboard::Scan::Help:               return "Help";
        case Keyboard::Scan::Menu:               return "Menu";
        case Keyboard::Scan::Select:             return "Select";
        case Keyboard::Scan::Stop:               return "Stop";
        case Keyboard::Scan::Redo:               return "Redo";
        case Keyboard::Scan::Undo:               return "Undo";
        case Keyboard::Scan::Cut:                return "Cut";
        case Keyboard::Scan::Copy:               return "Copy";
        case Keyboard::Scan::Paste:              return "Paste";
        case Keyboard::Scan::Search:             return "Search";

        case Keyboard::Scan::VolumeMute:         return "Volume Mute";
        case Keyboard::Scan::VolumeUp:           return "Volume Up";
        case Keyboard::Scan::VolumeDown:         return "Volume Down";

        case Keyboard::Scan::LControl:           return "Left Control";
        case Keyboard::Scan::LShift:             return "Left Shift";
        case Keyboard::Scan::LAlt:               return "Left Alt";
        case Keyboard::Scan::LSystem:            return "Left System";
        case Keyboard::Scan::RControl:           return "Right Control";
        case Keyboard::Scan::RShift:             return "Right Shift";
        case Keyboard::Scan::RAlt:               return "Right Alt";
        case Keyboard::Scan::RSystem:            return "Right System";

        case Keyboard::Scan::LaunchApplication1: return "Launch Application 1";
        case Keyboard::Scan::LaunchApplication2: return "Launch Application 2";
        case Keyboard::Scan::Favorites:          return "Favorites";
        case Keyboard::Scan::Back:               return "Back";
        case Keyboard::Scan::Forward:            return "Forward";
        case Keyboard::Scan::MediaNextTrack:     return "Media Next Track";
        case Keyboard::Scan::MediaPlayPause:     return "Media Play Pause";
        case Keyboard::Scan::MediaPreviousTrack: return "Media Previous Track";
        case Keyboard::Scan::MediaStop:          return "Media Stop";
        case Keyboard::Scan::HomePage:           return "Home Page";
        case Keyboard::Scan::Refresh:            return "Refresh";
        case Keyboard::Scan::LaunchMail:         return "Launch Mail";
        case Keyboard::Scan::LaunchMediaSelect:  return "Launch Media Select";

        default:                                 return "Unknown Scancode";
    }
}